

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_factory.cpp
# Opt level: O0

unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_> __thiscall
n_e_s::core::MmuFactory::create(MmuFactory *this,MemBankList *mem_banks)

{
  bool bVar1;
  Mmu *this_00;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_58;
  reference local_50;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *mem_bank;
  iterator __end2;
  iterator __begin2;
  MemBankList *__range2;
  Mmu *mmu;
  undefined1 local_19;
  MemBankList *local_18;
  MemBankList *mem_banks_local;
  unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_> *immu;
  
  local_19 = 0;
  local_18 = mem_banks;
  mem_banks_local = (MemBankList *)this;
  std::make_unique<n_e_s::core::Mmu>();
  std::unique_ptr<n_e_s::core::IMmu,std::default_delete<n_e_s::core::IMmu>>::
  unique_ptr<n_e_s::core::Mmu,std::default_delete<n_e_s::core::Mmu>,void>
            ((unique_ptr<n_e_s::core::IMmu,std::default_delete<n_e_s::core::IMmu>> *)this,
             (unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> *)&mmu);
  std::unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> *)&mmu);
  this_00 = (Mmu *)std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::get
                             ((unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>
                               *)this);
  __end2 = std::
           vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
           ::begin(mem_banks);
  mem_bank = (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             std::
             vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
             ::end(mem_banks);
  while (bVar1 = __gnu_cxx::
                 operator==<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_*,_std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>_>
                           (&__end2,(__normal_iterator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_*,_std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>_>
                                     *)&mem_bank), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_*,_std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>_>
               ::operator*(&__end2);
    std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::unique_ptr
              (&local_58,local_50);
    Mmu::add_mem_bank(this_00,&local_58);
    std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
              (&local_58);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_*,_std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>_>
    ::operator++(&__end2);
  }
  return (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<IMmu> MmuFactory::create(MemBankList mem_banks) {
    std::unique_ptr<IMmu> immu = std::make_unique<Mmu>();
    auto mmu = static_cast<Mmu *>(immu.get());

    for (std::unique_ptr<IMemBank> &mem_bank : mem_banks) {
        mmu->add_mem_bank(std::move(mem_bank));
    }

    return immu;
}